

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.hh
# Opt level: O2

void __thiscall brown::MySimulator::MySimulator(MySimulator *this,Timer *timx,Timer *timy)

{
  Simulator::Simulator(&this->super_Simulator);
  (this->super_Simulator)._vptr_Simulator = (_func_int **)&PTR_hardwareLoop_00109d88;
  this->timx = timx;
  this->timy = timy;
  this->cy = 0;
  this->clk = 0;
  this->cx = 0;
  this->dirx = true;
  this->diry = true;
  this->isDown = false;
  return;
}

Assistant:

MySimulator(Timer& timx, Timer& timy):
        Simulator(), timx(timx), timy(timy) {}